

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void opj_j2k_read_float64_to_float(void *p_src_data,void *p_dest_data,OPJ_UINT32 p_nb_elem)

{
  long lVar1;
  OPJ_FLOAT64 l_temp;
  double local_30;
  
  for (lVar1 = 0; p_nb_elem != (OPJ_UINT32)lVar1; lVar1 = lVar1 + 1) {
    opj_read_double_LE((OPJ_BYTE *)p_src_data,(OPJ_FLOAT64 *)&local_30);
    p_src_data = (void *)((long)p_src_data + 8);
    *(float *)((long)p_dest_data + lVar1 * 4) = (float)local_30;
  }
  return;
}

Assistant:

static void  opj_j2k_read_float64_to_float(const void * p_src_data,
        void * p_dest_data, OPJ_UINT32 p_nb_elem)
{
    OPJ_BYTE * l_src_data = (OPJ_BYTE *) p_src_data;
    OPJ_FLOAT32 * l_dest_data = (OPJ_FLOAT32 *) p_dest_data;
    OPJ_UINT32 i;
    OPJ_FLOAT64 l_temp;

    for (i = 0; i < p_nb_elem; ++i) {
        opj_read_double(l_src_data, &l_temp);

        l_src_data += sizeof(OPJ_FLOAT64);

        *(l_dest_data++) = (OPJ_FLOAT32) l_temp;
    }
}